

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O2

ostream * Indexing::operator<<
                    (ostream *out,
                    LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *self)

{
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *puVar1;
  Node *pNVar2;
  Symbol *self_00;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *t;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *puVar6;
  uint uVar7;
  
  std::operator<<(out,"{ ");
  puVar1 = (self->_trees)._cursor;
  uVar7 = 0;
  bVar3 = false;
  for (puVar6 = (self->_trees)._stack; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    pNVar2 = ((puVar6->_M_t).
              super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
              .
              super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_false>
             ._M_head_impl)->_root;
    if (pNVar2 != (Node *)0x0) {
      iVar4 = (*pNVar2->_vptr_Node[3])();
      if ((char)iVar4 == '\0') {
        self_00 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x80) + (ulong)(uVar7 >> 1) * 8);
        if (bVar3) {
          std::operator<<(out,"~");
        }
        poVar5 = Kernel::operator<<(out,self_00);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = operator<<(poVar5,(puVar6->_M_t).
                                   super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                                   .
                                   super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_false>
                                   ._M_head_impl);
        std::operator<<(poVar5,"), ");
      }
    }
    uVar7 = uVar7 + 1;
    bVar3 = (bool)(bVar3 ^ 1);
  }
  poVar5 = std::operator<<(out,"} ");
  return poVar5;
}

Assistant:

std::ostream& operator<<(std::ostream& out, LiteralSubstitutionTree const& self)
  { 
    int i = 0;
    out << "{ ";
    for (auto& t : self._trees) {
      if (!t->isEmpty()) {
        auto f = env.signature->getPredicate(idxToFunctor(i));
        if (idxIsNegative(i)) out << "~";
        out << *f << "(" << *t << "), "; 
      }
      i++;
    }
    return out << "} ";
  }